

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(xpath_stack_data *this)

{
  xpath_allocator::release(&this->result);
  xpath_allocator::release(&this->temp);
  return;
}

Assistant:

~xpath_stack_data()
		{
			result.release();
			temp.release();
		}